

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O0

CTInfo lj_ctype_info(CTState *cts,CTypeID id,CTSize *szp)

{
  uint uVar1;
  CTSize local_70;
  CTInfo info;
  CType *ct;
  CTInfo qual;
  CTSize *szp_local;
  CTypeID id_local;
  CTState *cts_local;
  
  qual = 0;
  ct = cts->tab + id;
  do {
    uVar1 = ct->info;
    if (uVar1 >> 0x1c != 5) {
      if (uVar1 >> 0x1c != 8) {
        if ((qual & 1) == 0) {
          qual = uVar1 & 0xf0000 | qual;
        }
        if (uVar1 >> 0x1c == 6) {
          local_70 = 0xffffffff;
        }
        else {
          local_70 = ct->size;
        }
        *szp = local_70;
        return uVar1 & 0xfff00000 | qual;
      }
      if ((uVar1 & 0xf0ff0000) == 0x80010000) {
        qual = ct->size | qual;
      }
      else if (((uVar1 & 0xf0ff0000) == 0x80020000) && ((qual & 1) == 0)) {
        qual = ct->size * 0x10000 + 1 | qual;
      }
    }
    ct = cts->tab + (uVar1 & 0xffff);
  } while( true );
}

Assistant:

CTInfo lj_ctype_info(CTState *cts, CTypeID id, CTSize *szp)
{
  CTInfo qual = 0;
  CType *ct = ctype_get(cts, id);
  for (;;) {
    CTInfo info = ct->info;
    if (ctype_isenum(info)) {
      /* Follow child. Need to look at its attributes, too. */
    } else if (ctype_isattrib(info)) {
      if (ctype_isxattrib(info, CTA_QUAL))
	qual |= ct->size;
      else if (ctype_isxattrib(info, CTA_ALIGN) && !(qual & CTFP_ALIGNED))
	qual |= CTFP_ALIGNED + CTALIGN(ct->size);
    } else {
      if (!(qual & CTFP_ALIGNED)) qual |= (info & CTF_ALIGN);
      qual |= (info & ~(CTF_ALIGN|CTMASK_CID));
      lua_assert(ctype_hassize(info) || ctype_isfunc(info));
      *szp = ctype_isfunc(info) ? CTSIZE_INVALID : ct->size;
      break;
    }
    ct = ctype_get(cts, ctype_cid(info));
  }
  return qual;
}